

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall QPDF::JSONReactor::error(JSONReactor *this,qpdf_offset_t offset,string *msg)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_70;
  string object;
  
  this->errors = true;
  std::__cxx11::string::string((string *)&object,(string *)&this->cur_object);
  iVar2 = (*((this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_InputSource[3])();
  getFilename_abi_cxx11_(&local_70,this->pdf);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar2),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    iVar2 = (*((this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_InputSource[3])();
    std::operator+(&local_70," from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::append((string *)&object);
    std::__cxx11::string::~string((string *)&local_70);
  }
  warn(this->pdf,qpdf_e_json,&object,offset,msg);
  std::__cxx11::string::~string((string *)&object);
  return;
}

Assistant:

void
QPDF::JSONReactor::error(qpdf_offset_t offset, std::string const& msg)
{
    errors = true;
    std::string object = this->cur_object;
    if (is->getName() != pdf.getFilename()) {
        object += " from " + is->getName();
    }
    pdf.warn(qpdf_e_json, object, offset, msg);
}